

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NutDecompiler.cpp
# Opt level: O0

bool __thiscall VMState::InitVar(VMState *this,int pos,ExpressionPtr *exp,bool foreachInit)

{
  int64_t startAddress;
  int64_t endAddress;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  Error *this_00;
  pointer pLVar4;
  reference pvVar5;
  element_type *peVar6;
  VariableExpression *this_01;
  string *__lhs;
  LocalVarInitStatement *this_02;
  pointer pLVar7;
  LocalVariableExpression *this_03;
  __type local_e9;
  shared_ptr<Expression> local_b0;
  undefined1 local_99;
  shared_ptr<Expression> local_98;
  shared_ptr<Statement> local_88;
  byte local_71;
  shared_ptr<Expression> local_70;
  __normal_iterator<const_NutFunction::LocalVarInfo_*,_std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>_>
  local_60;
  __normal_iterator<const_NutFunction::LocalVarInfo_*,_std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>_>
  local_58;
  const_iterator i;
  bool foreachInit_local;
  ExpressionPtr *exp_local;
  int pos_local;
  VMState *this_local;
  
  if ((pos < 0) ||
     (sVar3 = std::vector<VMState::StackElement,_std::allocator<VMState::StackElement>_>::size
                        (&this->m_Stack), (int)sVar3 <= pos)) {
    this_00 = (Error *)__cxa_allocate_exception(0x28);
    Error::Error(this_00,"Accessing non valid stack position.");
    __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)exp);
  if (bVar1) {
    peVar6 = std::__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )exp);
    iVar2 = (**peVar6->_vptr_Expression)();
    if (iVar2 == 2) {
      std::shared_ptr<Expression>::shared_ptr((shared_ptr<Expression> *)&i);
      std::shared_ptr<Expression>::operator=(exp,(shared_ptr<Expression> *)&i);
      std::shared_ptr<Expression>::~shared_ptr((shared_ptr<Expression> *)&i);
    }
  }
  local_58._M_current =
       (LocalVarInfo *)
       std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>::begin
                 (&this->m_Parent->m_Locals);
  do {
    local_60._M_current =
         (LocalVarInfo *)
         std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>::end
                   (&this->m_Parent->m_Locals);
    bVar1 = __gnu_cxx::operator!=(&local_58,&local_60);
    if (!bVar1) {
      return false;
    }
    pLVar4 = __gnu_cxx::
             __normal_iterator<const_NutFunction::LocalVarInfo_*,_std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>_>
             ::operator->(&local_58);
    if (((pLVar4->pos == (long)pos) &&
        (pLVar4 = __gnu_cxx::
                  __normal_iterator<const_NutFunction::LocalVarInfo_*,_std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>_>
                  ::operator->(&local_58), (bool)(pLVar4->foreachLoopState & 1U) == foreachInit)) &&
       ((iVar2 = this->m_IP,
        pLVar4 = __gnu_cxx::
                 __normal_iterator<const_NutFunction::LocalVarInfo_*,_std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>_>
                 ::operator->(&local_58), (long)iVar2 == pLVar4->start_op ||
        (((foreachInit &&
          (iVar2 = this->m_IP,
          pLVar4 = __gnu_cxx::
                   __normal_iterator<const_NutFunction::LocalVarInfo_*,_std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>_>
                   ::operator->(&local_58), pLVar4->start_op <= (long)iVar2)) &&
         (iVar2 = this->m_IP,
         pLVar4 = __gnu_cxx::
                  __normal_iterator<const_NutFunction::LocalVarInfo_*,_std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>_>
                  ::operator->(&local_58), (long)iVar2 <= pLVar4->end_op)))))) {
      pvVar5 = std::vector<VMState::StackElement,_std::allocator<VMState::StackElement>_>::
               operator[](&this->m_Stack,(long)pos);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)pvVar5);
      local_71 = 0;
      local_e9 = false;
      if (bVar1) {
        pvVar5 = std::vector<VMState::StackElement,_std::allocator<VMState::StackElement>_>::
                 operator[](&this->m_Stack,(long)pos);
        peVar6 = std::__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)pvVar5);
        iVar2 = (**peVar6->_vptr_Expression)();
        local_e9 = false;
        if (iVar2 == 4) {
          std::vector<VMState::StackElement,_std::allocator<VMState::StackElement>_>::operator[]
                    (&this->m_Stack,(long)pos);
          std::static_pointer_cast<LocalVariableExpression,Expression>(&local_70);
          local_71 = 1;
          this_01 = &std::
                     __shared_ptr_access<LocalVariableExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<LocalVariableExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&local_70)->super_VariableExpression;
          __lhs = VariableExpression::GetVariableName_abi_cxx11_(this_01);
          pLVar4 = __gnu_cxx::
                   __normal_iterator<const_NutFunction::LocalVarInfo_*,_std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>_>
                   ::operator->(&local_58);
          local_e9 = std::operator==(__lhs,&pLVar4->name);
        }
      }
      if ((local_71 & 1) != 0) {
        std::shared_ptr<LocalVariableExpression>::~shared_ptr
                  ((shared_ptr<LocalVariableExpression> *)&local_70);
      }
      if (local_e9 != false) {
        return false;
      }
      pLVar4 = __gnu_cxx::
               __normal_iterator<const_NutFunction::LocalVarInfo_*,_std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>_>
               ::operator->(&local_58);
      if (((pLVar4->end_op <= (long)(this->m_BlockState).blockEnd) ||
          ((this->m_BlockState).inLoop != '\0')) || ((this->m_BlockState).inSwitch != '\0')) {
        if (!foreachInit) {
          this_02 = (LocalVarInitStatement *)operator_new(0x60);
          local_99 = 1;
          pLVar4 = __gnu_cxx::
                   __normal_iterator<const_NutFunction::LocalVarInfo_*,_std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>_>
                   ::operator->(&local_58);
          pLVar7 = __gnu_cxx::
                   __normal_iterator<const_NutFunction::LocalVarInfo_*,_std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>_>
                   ::operator->(&local_58);
          startAddress = pLVar7->start_op;
          pLVar7 = __gnu_cxx::
                   __normal_iterator<const_NutFunction::LocalVarInfo_*,_std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>_>
                   ::operator->(&local_58);
          endAddress = pLVar7->end_op;
          std::shared_ptr<Expression>::shared_ptr(&local_98,exp);
          LocalVarInitStatement::LocalVarInitStatement
                    (this_02,&pLVar4->name,(long)pos,startAddress,endAddress,&local_98);
          local_99 = 0;
          std::shared_ptr<Statement>::shared_ptr<LocalVarInitStatement,void>(&local_88,this_02);
          PushStatement(this,&local_88);
          std::shared_ptr<Statement>::~shared_ptr(&local_88);
          std::shared_ptr<Expression>::~shared_ptr(&local_98);
        }
        this_03 = (LocalVariableExpression *)operator_new(0x28);
        pLVar4 = __gnu_cxx::
                 __normal_iterator<const_NutFunction::LocalVarInfo_*,_std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>_>
                 ::operator->(&local_58);
        LocalVariableExpression::LocalVariableExpression(this_03,&pLVar4->name);
        std::shared_ptr<Expression>::shared_ptr<LocalVariableExpression,void>(&local_b0,this_03);
        pvVar5 = std::vector<VMState::StackElement,_std::allocator<VMState::StackElement>_>::
                 operator[](&this->m_Stack,(long)pos);
        std::shared_ptr<Expression>::operator=(&pvVar5->expression,&local_b0);
        std::shared_ptr<Expression>::~shared_ptr(&local_b0);
        pvVar5 = std::vector<VMState::StackElement,_std::allocator<VMState::StackElement>_>::
                 operator[](&this->m_Stack,(long)pos);
        std::vector<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_>::clear
                  (&pvVar5->pendingStatements);
        return true;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_NutFunction::LocalVarInfo_*,_std::vector<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>_>
    ::operator++(&local_58);
  } while( true );
}

Assistant:

bool InitVar( int pos, ExpressionPtr exp = ExpressionPtr(), bool foreachInit = false )
	{
		if (pos < 0 || pos >= (int)m_Stack.size())
			throw Error("Accessing non valid stack position.");

		if (exp && exp->GetType() == Exp_Null)
			exp = ExpressionPtr();

		// Check for local initialization
		for( vector<NutFunction::LocalVarInfo>::const_iterator i = m_Parent.m_Locals.begin(); i != m_Parent.m_Locals.end(); ++i)
		{
			// Variable stack address
			if (i->pos != pos) continue;

			// Match foreach state variables
			if (i->foreachLoopState != foreachInit) continue;

			// Variable scope range
			if (m_IP != i->start_op && (!foreachInit || m_IP < i->start_op || m_IP > i->end_op)) continue;

			if (m_Stack[pos].expression && m_Stack[pos].expression->GetType() == Exp_LocalVariable 
				&& static_pointer_cast<LocalVariableExpression>(m_Stack[pos].expression)->GetVariableName() == i->name)
			{
				// This variable is already initialized
				break;
			}

			if (i->end_op > m_BlockState.blockEnd && m_BlockState.inLoop == 0 && m_BlockState.inSwitch == 0)
			{
				// Initialization of variable that reaches out of current if block - ignore
				continue;
			}

			// This is local initialization
			if (!foreachInit)
			{
				PushStatement(StatementPtr(new LocalVarInitStatement(i->name, pos, i->start_op, i->end_op, exp)));
			}

			m_Stack[pos].expression = ExpressionPtr(new LocalVariableExpression(i->name));
			m_Stack[pos].pendingStatements.clear();

			return true;
		}

		return false;
	}